

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O3

void duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>>
               (Vector *constant,Vector *other,Vector *result,DataChunk *args)

{
  _func_int **pp_Var1;
  Vector VVar2;
  UnifiedVectorFormat *pUVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  _func_int *p_Var8;
  byte bVar9;
  double dVar10;
  undefined1 auVar11 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  unsigned_long uVar14;
  long *plVar15;
  reference pvVar16;
  UnifiedVectorFormat *pUVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  UnifiedVectorFormat *pUVar21;
  ulong uVar22;
  VectorType VVar23;
  char *other_str_begin;
  ulong uVar24;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar25;
  Vector *pVVar26;
  ulong *puVar27;
  undefined8 *puVar28;
  CachedJaroWinklerSimilarity<char> cached;
  UnifiedVectorFormat ldata;
  value_type score_cutoff;
  string str_val;
  Value val;
  undefined8 *local_238;
  ulong *local_230;
  CachedJaroWinklerSimilarity<char> local_218;
  undefined1 local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  long local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  undefined8 *local_150;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  byte *local_120;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  long local_d8;
  char local_d0 [16];
  unsigned_long local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  Value local_70 [24];
  char local_58;
  
  duckdb::Vector::GetValue((ulong)local_70);
  pUVar3 = *(UnifiedVectorFormat **)(args + 0x18);
  if (local_58 == '\x01') {
    FlatVector::VerifyFlatVector(result);
    _Var18._M_head_impl = *(unsigned_long **)(result + 0x28);
    if (_Var18._M_head_impl == (unsigned_long *)0x0) {
      local_218.s1._M_dataplus._M_p = *(pointer *)(result + 0x40);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_148,(unsigned_long *)&local_218);
      p_Var20 = p_Stack_140;
      auVar11 = local_148;
      local_148 = (undefined1  [8])0x0;
      p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var19 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(undefined1 (*) [8])(result + 0x30) = auVar11;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var20;
      if ((p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19),
         p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
      }
      pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      _Var18._M_head_impl =
           (pTVar13->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(unsigned_long **)(result + 0x28) = _Var18._M_head_impl;
    }
    if (pUVar3 != (UnifiedVectorFormat *)0x0) {
      uVar22 = (ulong)(pUVar3 + 0x3f) >> 6;
      if (uVar22 != 1) {
        memset(_Var18._M_head_impl,0,uVar22 * 8 - 8);
      }
      uVar14 = -1L << ((byte)pUVar3 & 0x3f);
      if (((ulong)pUVar3 & 0x3f) == 0) {
        uVar14 = 0;
      }
      _Var18._M_head_impl[uVar22 - 1] = uVar14;
    }
    goto LAB_00742b5c;
  }
  plVar15 = (long *)duckdb::StringValue::Get_abi_cxx11_(local_70);
  local_e0._M_current = local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,*plVar15,plVar15[1] + *plVar15);
  duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>::
  CachedJaroWinklerSimilarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_218,local_e0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_e0._M_current + local_d8),0.1);
  VVar23 = (VectorType)result;
  if (*(long *)(args + 8) - *(long *)args == 0xd0) {
    if (*other == (Vector)0x0) {
      duckdb::Vector::SetVectorType(VVar23);
      lVar7 = *(long *)(result + 0x20);
      lVar6 = *(long *)(other + 0x20);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      if (*(long *)(other + 0x28) == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          local_238 = (undefined8 *)(lVar6 + 8);
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            local_148 = (undefined1  [8])local_238[-1];
            p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_238;
            p_Var19 = p_Stack_140;
            if (SUB84(local_148,0) < 0xd) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var19,
                                (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                        ((ulong)local_148 & 0xffffffff)),local_218.prefix_weight,0.0
                               );
            *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
            local_238 = local_238 + 2;
          } while (pUVar3 != pUVar25);
        }
      }
      else {
        *(long *)(result + 0x28) = *(long *)(other + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(other + 0x30)
                  );
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(other + 0x40);
        if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
          lVar6 = lVar6 + 8;
          uVar22 = 0;
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)(other + 0x28) == 0) {
              pUVar17 = pUVar25 + 0x40;
              if (pUVar3 <= pUVar25 + 0x40) {
                pUVar17 = pUVar3;
              }
LAB_0074278c:
              pUVar21 = pUVar25;
              if (pUVar25 < pUVar17) {
                puVar28 = (undefined8 *)((long)pUVar25 * 0x10 + lVar6);
                do {
                  local_148 = (undefined1  [8])puVar28[-1];
                  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                  p_Var19 = p_Stack_140;
                  if (SUB84(local_148,0) < 0xd) {
                    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                  }
                  dVar10 = duckdb_jaro_winkler::detail::
                           jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_218.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_218.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_218.s1._M_dataplus._M_p +
                                        local_218.s1._M_string_length),(char *)p_Var19,
                                      (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                              ((ulong)local_148 & 0xffffffff)),
                                      local_218.prefix_weight,0.0);
                  *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
                  pUVar25 = pUVar25 + 1;
                  puVar28 = puVar28 + 2;
                  pUVar21 = pUVar17;
                } while (pUVar17 != pUVar25);
              }
            }
            else {
              uVar5 = *(ulong *)(*(long *)(other + 0x28) + uVar22 * 8);
              pUVar17 = pUVar25 + 0x40;
              if (pUVar3 <= pUVar25 + 0x40) {
                pUVar17 = pUVar3;
              }
              pUVar21 = pUVar17;
              if (uVar5 != 0) {
                if (uVar5 == 0xffffffffffffffff) goto LAB_0074278c;
                pUVar21 = pUVar25;
                if (pUVar25 < pUVar17) {
                  puVar28 = (undefined8 *)((long)pUVar25 * 0x10 + lVar6);
                  uVar24 = 0;
                  do {
                    if ((uVar5 >> (uVar24 & 0x3f) & 1) != 0) {
                      local_148 = (undefined1  [8])puVar28[-1];
                      p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                      p_Var19 = p_Stack_140;
                      if (SUB84(local_148,0) < 0xd) {
                        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                      }
                      dVar10 = duckdb_jaro_winkler::detail::
                               jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                         (&local_218.PM,
                                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )local_218.s1._M_dataplus._M_p,
                                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )(local_218.s1._M_dataplus._M_p +
                                            local_218.s1._M_string_length),(char *)p_Var19,
                                          (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                                  ((ulong)local_148 & 0xffffffff)),
                                          local_218.prefix_weight,0.0);
                      *(double *)(lVar7 + (long)pUVar25 * 8 + uVar24 * 8) = dVar10;
                    }
                    uVar24 = uVar24 + 1;
                    puVar28 = puVar28 + 2;
                    pUVar21 = pUVar17;
                  } while ((long)pUVar17 - (long)pUVar25 != uVar24);
                }
              }
            }
            uVar22 = uVar22 + 1;
            pUVar25 = pUVar21;
          } while (uVar22 != (ulong)(pUVar3 + 0x3f) >> 6);
        }
      }
    }
    else if (*other == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar23);
      pdVar4 = *(double **)(result + 0x20);
      puVar28 = *(undefined8 **)(other + 0x20);
      if ((*(byte **)(other + 0x28) == (byte *)0x0) || ((**(byte **)(other + 0x28) & 1) != 0)) {
        duckdb::ConstantVector::SetNull(result,false);
        local_148 = (undefined1  [8])*puVar28;
        p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
        p_Var19 = p_Stack_140;
        if (SUB84(local_148,0) < 0xd) {
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
        }
        dVar10 = duckdb_jaro_winkler::detail::
                 jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_218.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_218.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                            (char *)p_Var19,
                            (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                    ((ulong)local_148 & 0xffffffff)),local_218.prefix_weight,0.0);
        *pdVar4 = dVar10;
      }
      else {
        duckdb::ConstantVector::SetNull(result,true);
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_148);
      duckdb::Vector::ToUnifiedFormat((ulong)other,pUVar3);
      duckdb::Vector::SetVectorType(VVar23);
      p_Var19 = p_Stack_140;
      auVar11 = local_148;
      lVar6 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (local_138 == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          lVar7 = *(long *)auVar11;
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            pUVar17 = pUVar25;
            if (lVar7 != 0) {
              pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar25 * 4);
            }
            local_1b8 = (undefined1  [8])p_Var19[(long)pUVar17]._vptr__Sp_counted_base;
            p_Stack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var19[(long)pUVar17]._M_use_count;
            p_Var20 = p_Stack_1b0;
            if (SUB84(local_1b8,0) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight,0.0
                               );
            *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
          } while (pUVar3 != pUVar25);
        }
      }
      else if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        lVar7 = *(long *)auVar11;
        pUVar25 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar17 = pUVar25;
          if (lVar7 != 0) {
            pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar25 * 4);
          }
          if ((*(ulong *)(local_138 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1) ==
              0) {
            _Var18._M_head_impl = *(unsigned_long **)(result + 0x28);
            if (_Var18._M_head_impl == (unsigned_long *)0x0) {
              local_b8 = *(long **)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_1b8,(unsigned_long *)&local_b8);
              p_Var12 = p_Stack_1b0;
              auVar11 = local_1b8;
              local_1b8 = (undefined1  [8])0x0;
              p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined1 (*) [8])(result + 0x30) = auVar11;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var12;
              if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
                 p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              _Var18._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              *(unsigned_long **)(result + 0x28) = _Var18._M_head_impl;
            }
            bVar9 = (byte)pUVar25 & 0x3f;
            _Var18._M_head_impl[(ulong)pUVar25 >> 6] =
                 _Var18._M_head_impl[(ulong)pUVar25 >> 6] &
                 (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          else {
            local_1b8 = (undefined1  [8])p_Var19[(long)pUVar17]._vptr__Sp_counted_base;
            p_Stack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var19[(long)pUVar17]._M_use_count;
            p_Var20 = p_Stack_1b0;
            if (SUB84(local_1b8,0) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight,0.0
                               );
            *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
          }
          pUVar25 = pUVar25 + 1;
        } while (pUVar3 != pUVar25);
      }
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
    }
  }
  else {
    pvVar16 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
    duckdb::Vector::Vector((Vector *)local_148,pvVar16);
    VVar2 = *other;
    if (((byte)VVar2 ^ 2) == 0 && ((byte)local_148[0] ^ 2) == 0) {
      duckdb::Vector::SetVectorType(VVar23);
      pdVar4 = *(double **)(result + 0x20);
      if (((*(byte **)(other + 0x28) == (byte *)0x0) || ((**(byte **)(other + 0x28) & 1) != 0)) &&
         ((local_120 == (byte *)0x0 || ((*local_120 & 1) != 0)))) {
        local_1b8 = (undefined1  [8])**(ulong **)(other + 0x20);
        p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(ulong **)(other + 0x20))[1]
        ;
        p_Var19 = p_Stack_1b0;
        if (SUB84(local_1b8,0) < 0xd) {
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
        }
        dVar10 = duckdb_jaro_winkler::detail::
                 jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_218.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_218.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                            (char *)p_Var19,
                            (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                    ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight,
                            (double)local_128->_vptr__Sp_counted_base);
        *pdVar4 = dVar10;
      }
      else {
LAB_00742ac1:
        duckdb::ConstantVector::SetNull(result,true);
      }
    }
    else if (((byte)local_148[0] ^ 2) == 0 && VVar2 == (Vector)0x0) {
      lVar6 = *(long *)(other + 0x20);
      if ((local_120 != (byte *)0x0) && ((*local_120 & 1) == 0)) {
LAB_00742ab4:
        duckdb::Vector::SetVectorType(VVar23);
        goto LAB_00742ac1;
      }
      duckdb::Vector::SetVectorType(VVar23);
      lVar7 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      *(undefined8 *)(result + 0x28) = *(undefined8 *)(other + 0x28);
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(other + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(other + 0x40);
      if (*(long *)(result + 0x28) == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          pp_Var1 = local_128->_vptr__Sp_counted_base;
          local_230 = (ulong *)(lVar6 + 8);
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            local_1b8 = (undefined1  [8])local_230[-1];
            p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_230;
            p_Var19 = p_Stack_1b0;
            if (SUB84(local_1b8,0) < 0xd) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var19,
                                (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                        ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight,
                                (double)pp_Var1);
            *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
            local_230 = local_230 + 2;
          } while (pUVar3 != pUVar25);
        }
      }
      else if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
        lVar6 = lVar6 + 8;
        uVar22 = 0;
        pUVar25 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
LAB_00742629:
            pUVar21 = pUVar25;
            if (pUVar25 < pUVar17) {
              pp_Var1 = local_128->_vptr__Sp_counted_base;
              puVar27 = (ulong *)((long)pUVar25 * 0x10 + lVar6);
              do {
                local_1b8 = (undefined1  [8])puVar27[-1];
                p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar27;
                p_Var19 = p_Stack_1b0;
                if (SUB84(local_1b8,0) < 0xd) {
                  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
                }
                dVar10 = duckdb_jaro_winkler::detail::
                         jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_218.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_218.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length
                                      ),(char *)p_Var19,
                                    (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                            ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight
                                    ,(double)pp_Var1);
                *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
                pUVar25 = pUVar25 + 1;
                puVar27 = puVar27 + 2;
                pUVar21 = pUVar17;
              } while (pUVar17 != pUVar25);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)(result + 0x28) + uVar22 * 8);
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
            pUVar21 = pUVar17;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_00742629;
              pUVar21 = pUVar25;
              if (pUVar25 < pUVar17) {
                puVar27 = (ulong *)((long)pUVar25 * 0x10 + lVar6);
                uVar24 = 0;
                do {
                  if ((uVar5 >> (uVar24 & 0x3f) & 1) != 0) {
                    local_1b8 = (undefined1  [8])puVar27[-1];
                    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar27;
                    p_Var19 = p_Stack_1b0;
                    if (SUB84(local_1b8,0) < 0xd) {
                      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
                    }
                    dVar10 = duckdb_jaro_winkler::detail::
                             jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_218.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_218.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_218.s1._M_dataplus._M_p +
                                          local_218.s1._M_string_length),(char *)p_Var19,
                                        (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                                ((ulong)local_1b8 & 0xffffffff)),
                                        local_218.prefix_weight,
                                        (double)local_128->_vptr__Sp_counted_base);
                    *(double *)(lVar7 + (long)pUVar25 * 8 + uVar24 * 8) = dVar10;
                  }
                  uVar24 = uVar24 + 1;
                  puVar27 = puVar27 + 2;
                  pUVar21 = pUVar17;
                } while ((long)pUVar17 - (long)pUVar25 != uVar24);
              }
            }
          }
          uVar22 = uVar22 + 1;
          pUVar25 = pUVar21;
        } while (uVar22 != (ulong)(pUVar3 + 0x3f) >> 6);
      }
    }
    else if (((byte)VVar2 ^ 2) == 0 && local_148[0] == (duckdb)0x0) {
      puVar28 = *(undefined8 **)(other + 0x20);
      if ((*(byte **)(other + 0x28) != (byte *)0x0) && ((**(byte **)(other + 0x28) & 1) == 0))
      goto LAB_00742ab4;
      duckdb::Vector::SetVectorType(VVar23);
      lVar6 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector((Vector *)local_148);
      FlatVector::VerifyFlatVector(result);
      *(byte **)(result + 0x28) = local_120;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 &local_118);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x40) = local_108;
      if (*(long *)(result + 0x28) == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          pp_Var1 = (_func_int **)*puVar28;
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
          p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
          if (0xc < (uint)pp_Var1) {
            p_Var20 = p_Var19;
          }
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            local_1b8 = (undefined1  [8])pp_Var1;
            p_Stack_1b0 = p_Var19;
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)pp_Var1 & 0xffffffff)),local_218.prefix_weight,
                                (double)(&local_128->_vptr__Sp_counted_base)[(long)pUVar25]);
            *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
          } while (pUVar3 != pUVar25);
        }
      }
      else if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
        uVar22 = 0;
        pUVar25 = (UnifiedVectorFormat *)0x0;
        local_150 = puVar28;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
LAB_00742f18:
            pUVar21 = pUVar25;
            if (pUVar25 < pUVar17) {
              pp_Var1 = (_func_int **)*puVar28;
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
              p_Var20 = p_Var19;
              if ((uint)pp_Var1 < 0xd) {
                p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
              }
              do {
                local_1b8 = (undefined1  [8])pp_Var1;
                p_Stack_1b0 = p_Var19;
                dVar10 = duckdb_jaro_winkler::detail::
                         jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_218.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_218.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length
                                      ),(char *)p_Var20,
                                    (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                            ((ulong)pp_Var1 & 0xffffffff)),local_218.prefix_weight,
                                    (double)(&local_128->_vptr__Sp_counted_base)[(long)pUVar25]);
                *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
                pUVar25 = pUVar25 + 1;
                puVar28 = local_150;
                pUVar21 = pUVar17;
              } while (pUVar17 != pUVar25);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)(result + 0x28) + uVar22 * 8);
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
            pUVar21 = pUVar17;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_00742f18;
              pUVar21 = pUVar25;
              if (pUVar25 < pUVar17) {
                uVar24 = 0;
                do {
                  if ((uVar5 >> (uVar24 & 0x3f) & 1) != 0) {
                    local_1b8 = (undefined1  [8])*puVar28;
                    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
                    p_Var19 = p_Stack_1b0;
                    if (SUB84(local_1b8,0) < 0xd) {
                      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
                    }
                    dVar10 = duckdb_jaro_winkler::detail::
                             jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_218.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_218.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_218.s1._M_dataplus._M_p +
                                          local_218.s1._M_string_length),(char *)p_Var19,
                                        (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                                ((ulong)local_1b8 & 0xffffffff)),
                                        local_218.prefix_weight,
                                        (double)(&local_128->_vptr__Sp_counted_base)
                                                [(long)(pUVar25 + uVar24)]);
                    *(double *)(lVar6 + (long)pUVar25 * 8 + uVar24 * 8) = dVar10;
                  }
                  uVar24 = uVar24 + 1;
                  pUVar21 = pUVar17;
                } while ((long)pUVar17 - (long)pUVar25 != uVar24);
              }
            }
          }
          uVar22 = uVar22 + 1;
          pUVar25 = pUVar21;
        } while (uVar22 != (ulong)(pUVar3 + 0x3f) >> 6);
      }
    }
    else if (local_148[0] == (duckdb)0x0 && VVar2 == (Vector)0x0) {
      lVar6 = *(long *)(other + 0x20);
      duckdb::Vector::SetVectorType(VVar23);
      lVar7 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      *(undefined8 *)(result + 0x28) = *(undefined8 *)(other + 0x28);
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(other + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(other + 0x40);
      FlatVector::VerifyFlatVector((Vector *)local_148);
      pVVar26 = result + 0x28;
      duckdb::ValidityMask::Combine((ValidityMask *)pVVar26,(ulong)&local_120);
      if (*(long *)pVVar26 == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          puVar27 = (ulong *)(lVar6 + 8);
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            local_1b8 = (undefined1  [8])puVar27[-1];
            p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar27;
            p_Var19 = p_Stack_1b0;
            if (SUB84(local_1b8,0) < 0xd) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var19,
                                (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                        ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight,
                                (double)(&local_128->_vptr__Sp_counted_base)[(long)pUVar25]);
            *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
            puVar27 = puVar27 + 2;
          } while (pUVar3 != pUVar25);
        }
      }
      else if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
        puVar28 = (undefined8 *)(lVar6 + 8);
        uVar22 = 0;
        pUVar25 = (UnifiedVectorFormat *)0x0;
        local_150 = puVar28;
        do {
          if (*(long *)pVVar26 == 0) {
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
LAB_007432de:
            pUVar21 = pUVar25;
            if (pUVar25 < pUVar17) {
              puVar27 = puVar28 + (long)pUVar25 * 2;
              do {
                local_1b8 = (undefined1  [8])puVar27[-1];
                p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar27;
                p_Var19 = p_Stack_1b0;
                if (SUB84(local_1b8,0) < 0xd) {
                  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
                }
                dVar10 = duckdb_jaro_winkler::detail::
                         jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                   (&local_218.PM,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_218.s1._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length
                                      ),(char *)p_Var19,
                                    (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                            ((ulong)local_1b8 & 0xffffffff)),local_218.prefix_weight
                                    ,(double)(&local_128->_vptr__Sp_counted_base)[(long)pUVar25]);
                *(double *)(lVar7 + (long)pUVar25 * 8) = dVar10;
                pUVar25 = pUVar25 + 1;
                puVar27 = puVar27 + 2;
                pUVar21 = pUVar17;
              } while (pUVar17 != pUVar25);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)pVVar26 + uVar22 * 8);
            pUVar17 = pUVar25 + 0x40;
            if (pUVar3 <= pUVar25 + 0x40) {
              pUVar17 = pUVar3;
            }
            pUVar21 = pUVar17;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_007432de;
              pUVar21 = pUVar25;
              if (pUVar25 < pUVar17) {
                puVar27 = puVar28 + (long)pUVar25 * 2;
                uVar24 = 0;
                do {
                  if ((uVar5 >> (uVar24 & 0x3f) & 1) != 0) {
                    local_1b8 = (undefined1  [8])puVar27[-1];
                    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar27;
                    p_Var19 = p_Stack_1b0;
                    if (SUB84(local_1b8,0) < 0xd) {
                      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 4);
                    }
                    dVar10 = duckdb_jaro_winkler::detail::
                             jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_218.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_218.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_218.s1._M_dataplus._M_p +
                                          local_218.s1._M_string_length),(char *)p_Var19,
                                        (char *)((long)&p_Var19->_vptr__Sp_counted_base +
                                                ((ulong)local_1b8 & 0xffffffff)),
                                        local_218.prefix_weight,
                                        (double)(&local_128->_vptr__Sp_counted_base)
                                                [(long)(pUVar25 + uVar24)]);
                    *(double *)(lVar7 + (long)pUVar25 * 8 + uVar24 * 8) = dVar10;
                  }
                  uVar24 = uVar24 + 1;
                  puVar27 = puVar27 + 2;
                  pUVar21 = pUVar17;
                  puVar28 = local_150;
                } while ((long)pUVar17 - (long)pUVar25 != uVar24);
              }
            }
          }
          uVar22 = uVar22 + 1;
          pUVar25 = pUVar21;
        } while (uVar22 != (ulong)(pUVar3 + 0x3f) >> 6);
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_1b8);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
      duckdb::Vector::ToUnifiedFormat((ulong)other,pUVar3);
      duckdb::Vector::ToUnifiedFormat((ulong)local_148,pUVar3);
      duckdb::Vector::SetVectorType(VVar23);
      plVar15 = local_b8;
      p_Var19 = p_Stack_1b0;
      auVar11 = local_1b8;
      lVar6 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (local_a8 == 0 && local_1a8 == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          p_Var8 = *(_func_int **)auVar11;
          lVar7 = *plVar15;
          pUVar25 = (UnifiedVectorFormat *)0x0;
          do {
            pUVar17 = pUVar25;
            if (p_Var8 != (_func_int *)0x0) {
              pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(p_Var8 + (long)pUVar25 * 4);
            }
            pUVar21 = pUVar25;
            if (lVar7 != 0) {
              pUVar21 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar25 * 4);
            }
            local_168 = (undefined1  [8])p_Var19[(long)pUVar17]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var19[(long)pUVar17]._M_use_count;
            p_Var20 = p_Stack_160;
            if (SUB84(local_168,0) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),local_218.prefix_weight,
                                *(double *)(local_b0 + (long)pUVar21 * 8));
            *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
            pUVar25 = pUVar25 + 1;
          } while (pUVar3 != pUVar25);
        }
      }
      else if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        p_Var8 = *(_func_int **)auVar11;
        lVar7 = *plVar15;
        pUVar25 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar17 = pUVar25;
          if (p_Var8 != (_func_int *)0x0) {
            pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(p_Var8 + (long)pUVar25 * 4);
          }
          pUVar21 = pUVar25;
          if (lVar7 != 0) {
            pUVar21 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar25 * 4);
          }
          if (((local_1a8 == 0) ||
              ((*(ulong *)(local_1a8 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1) !=
               0)) && ((local_a8 == 0 ||
                       ((*(ulong *)(local_a8 + ((ulong)pUVar21 >> 6) * 8) >> ((ulong)pUVar21 & 0x3f)
                        & 1) != 0)))) {
            local_168 = (undefined1  [8])p_Var19[(long)pUVar17]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var19[(long)pUVar17]._M_use_count;
            p_Var20 = p_Stack_160;
            if (SUB84(local_168,0) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar10 = duckdb_jaro_winkler::detail::
                     jaro_winkler_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_218.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_218.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_218.s1._M_dataplus._M_p + local_218.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),local_218.prefix_weight,
                                *(double *)(local_b0 + (long)pUVar21 * 8));
            *(double *)(lVar6 + (long)pUVar25 * 8) = dVar10;
          }
          else {
            _Var18._M_head_impl = *(unsigned_long **)(result + 0x28);
            if (_Var18._M_head_impl == (unsigned_long *)0x0) {
              local_c0 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_168,&local_c0);
              p_Var12 = p_Stack_160;
              auVar11 = local_168;
              local_168 = (undefined1  [8])0x0;
              p_Stack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined1 (*) [8])(result + 0x30) = auVar11;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var12;
              if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
                 p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              _Var18._M_head_impl =
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              *(unsigned_long **)(result + 0x28) = _Var18._M_head_impl;
            }
            bVar9 = (byte)pUVar25 & 0x3f;
            _Var18._M_head_impl[(ulong)pUVar25 >> 6] =
                 _Var18._M_head_impl[(ulong)pUVar25 >> 6] &
                 (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          pUVar25 = pUVar25 + 1;
        } while (pUVar3 != pUVar25);
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
      }
      if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
      }
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
    }
    if (local_118.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&p_Stack_140);
  }
  if (local_218.PM.m_extendedAscii.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.PM.m_extendedAscii.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_218.PM.m_map.
      super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.PM.m_map.
                    super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.s1._M_dataplus._M_p != &local_218.s1.field_2) {
    operator_delete(local_218.s1._M_dataplus._M_p);
  }
  if (local_e0._M_current != local_d0) {
    operator_delete(local_e0._M_current);
  }
LAB_00742b5c:
  duckdb::Value::~Value(local_70);
  return;
}

Assistant:

static void CachedFunction(Vector &constant, Vector &other, Vector &result, DataChunk &args) {
	auto val = constant.GetValue(0);
	idx_t count = args.size();
	if (val.IsNull()) {
		auto &result_validity = FlatVector::Validity(result);
		result_validity.SetAllInvalid(count);
		return;
	}

	auto str_val = StringValue::Get(val);
	auto cached = CACHED_SIMILARITY(str_val);

	D_ASSERT(args.ColumnCount() == 2 || args.ColumnCount() == 3);
	if (args.ColumnCount() == 2) {
		UnaryExecutor::Execute<string_t, double>(other, result, count, [&](const string_t &other_str) {
			auto other_str_begin = other_str.GetData();
			return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize());
		});
	} else {
		auto score_cutoff = args.data[2];
		BinaryExecutor::Execute<string_t, double_t, double>(
		    other, score_cutoff, result, count, [&](const string_t &other_str, const double_t score_cutoff) {
			    auto other_str_begin = other_str.GetData();
			    return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize(), score_cutoff);
		    });
	}
}